

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_wrappers.hpp
# Opt level: O1

size_t __thiscall pcplusplus::threads::generic_threads::join(generic_threads *this)

{
  ulong uVar1;
  
  if (this->num_threads != 0) {
    uVar1 = 0;
    do {
      std::thread::join();
      uVar1 = uVar1 + 1;
    } while (uVar1 < this->num_threads);
  }
  return this->num_processed;
}

Assistant:

virtual inline size_t join(){
		try{
		    for(size_t i = 0; i < num_threads; ++i)
			threads[i].join();
		}
		catch(const std::system_error& e){
		    throw exceptions::thread_failure("Failed to fork a " + thread_type + " thread.");
		}
		return num_processed;
	    }